

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O1

void m2v_L_mult_inplace(m2v *LU,m2v *X_inout)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  m2v_base *pmVar4;
  m2v_base *pmVar5;
  bool bVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  
  iVar8 = LU->n_row;
  iVar7 = iVar8;
  if (0 < iVar8) {
    do {
      iVar7 = iVar7 + -1;
      iVar9 = iVar8 + -1;
      if (LU->n_col < iVar8) {
        iVar2 = X_inout->row_stride;
        if (0 < iVar2) {
          pmVar4 = X_inout->e;
          lVar13 = 0;
          do {
            pmVar4[iVar2 * iVar7 + lVar13] = 0;
            lVar13 = lVar13 + 1;
          } while (lVar13 < X_inout->row_stride);
        }
        uVar3 = LU->n_col;
        if (0 < (int)uVar3) {
          pmVar4 = LU->e;
          uVar11 = uVar3;
          do {
            uVar3 = uVar3 - 1;
            uVar12 = uVar11 - 1;
            uVar10 = uVar11 + 0x1e;
            if (-1 < (int)uVar12) {
              uVar10 = uVar12;
            }
            if (((pmVar4[((int)uVar10 >> 5) + LU->row_stride * iVar9] >> (uVar12 & 0x1f) & 1) != 0)
               && (iVar2 = X_inout->row_stride, 0 < iVar2)) {
              pmVar5 = X_inout->e;
              lVar13 = 0;
              do {
                puVar1 = pmVar5 + iVar7 * iVar2 + lVar13;
                *puVar1 = *puVar1 ^ pmVar5[(int)(iVar2 * uVar3) + lVar13];
                lVar13 = lVar13 + 1;
              } while (lVar13 < X_inout->row_stride);
            }
            bVar6 = 1 < (int)uVar11;
            uVar11 = uVar12;
          } while (bVar6);
        }
      }
      else if (1 < iVar8) {
        pmVar4 = LU->e;
        uVar3 = iVar8 - 2;
        do {
          if (((pmVar4[(int)((uVar3 >> 5) + LU->row_stride * iVar9)] >> (uVar3 & 0x1f) & 1) != 0) &&
             (iVar2 = X_inout->row_stride, 0 < iVar2)) {
            pmVar5 = X_inout->e;
            lVar13 = 0;
            do {
              puVar1 = pmVar5 + iVar7 * iVar2 + lVar13;
              *puVar1 = *puVar1 ^ pmVar5[(ulong)(iVar2 * uVar3) + lVar13];
              lVar13 = lVar13 + 1;
            } while (lVar13 < X_inout->row_stride);
          }
          bVar6 = 0 < (int)uVar3;
          uVar3 = uVar3 - 1;
        } while (bVar6);
      }
      bVar6 = 1 < iVar8;
      iVar8 = iVar9;
    } while (bVar6);
  }
  return;
}

Assistant:

void MV_GEN_N(_L_mult_inplace)(const MV_GEN_TYPE* LU, MV_GEN_TYPE* X_inout)
{
	for (int i = LU->n_row - 1; i >= 0; --i) {
		if (i >= LU->n_col) {
			/* We're in the rectangle below the triangular part
			 */
			MV_GEN_N(_clear_row)(X_inout /* Y */, i);
			for (int j = LU->n_col - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		} else {
			/* i < LU->n_col, we're in the triangular part */
			for (int j = i - 1; j >= 0; --j) {
				MV_GEN_N(_multadd_row)(X_inout, j,
						MV_GEN_N(_get_el)(LU, i, j),
						X_inout, i);
			}
		}
	}
}